

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::end_pass(search *sch)

{
  long *plVar1;
  undefined8 uVar2;
  ostream *this;
  long *in_RDI;
  vw *all;
  search_private *priv;
  typed_option<unsigned_int> *this_00;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  options_i *in_stack_ffffffffffffff70;
  allocator local_39;
  string local_38 [32];
  long local_18;
  long *local_10;
  
  local_10 = (long *)*in_RDI;
  local_18 = *local_10;
  *(undefined1 *)(local_10 + 0x4a) = 1;
  local_10[0x5b] = local_10[0x5b] + 1;
  local_10[0x5a] = local_10[0x5a] + 1;
  if ((ulong)local_10[0x55] <= (ulong)local_10[0x5a]) {
    local_10[0x5a] = 0;
    if ((*(byte *)(local_18 + 0x343a) & 1) != 0) {
      *(int *)(local_10 + 0x56) = (int)local_10[0x56] + 1;
    }
    if (*(uint *)(local_10 + 0x58) < *(uint *)(local_10 + 0x56)) {
      this = std::operator<<((ostream *)&std::cerr,
                             "internal error (bug): too many policies; not advancing");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      *(int *)(local_10 + 0x56) = (int)local_10[0x58];
    }
    plVar1 = *(long **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"search_trained_nb_policies",&local_39);
    std::__cxx11::to_string(in_stack_ffffffffffffff6c);
    (**(code **)(*plVar1 + 0x30))(plVar1,local_38,&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    uVar2 = *(undefined8 *)(local_18 + 0x278);
    this_00 = (typed_option<unsigned_int> *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"search_trained_nb_policies",(allocator *)this_00)
    ;
    VW::config::options_i::get_typed_option<unsigned_int>
              (in_stack_ffffffffffffff70,
               (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    VW::config::typed_option<unsigned_int>::value(this_00,(uint)((ulong)uVar2 >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  return;
}

Assistant:

void end_pass(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;
  priv.hit_new_pass = true;
  priv.read_example_last_pass++;
  priv.passes_since_new_policy++;

  if (priv.passes_since_new_policy >= priv.passes_per_policy)
  {
    priv.passes_since_new_policy = 0;
    if (all->training)
      priv.current_policy++;
    if (priv.current_policy > priv.total_number_of_policies)
    {
      std::cerr << "internal error (bug): too many policies; not advancing" << std::endl;
      priv.current_policy = priv.total_number_of_policies;
    }
    // reset search_trained_nb_policies in options_from_file so it is saved to regressor file later
    // TODO work out a better system to update state that will be saved in the model.
    all->options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);
  }
}